

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_uint32
drmp3_decode_next_frame_ex(drmp3 *pMP3,drmp3d_sample_t *pPCMFrames,drmp3_bool32 discard)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int in_EDX;
  long in_RDI;
  size_t bytesRead_1;
  drmp3_uint8 *pNewData_1;
  size_t leftoverDataSize;
  drmp3dec_frame_info info;
  size_t bytesRead;
  drmp3_uint8 *pNewData;
  drmp3_uint32 pcmFramesRead;
  drmp3dec_frame_info *in_stack_000042d8;
  void *in_stack_000042e0;
  int in_stack_000042ec;
  uchar *in_stack_000042f0;
  drmp3dec *in_stack_000042f8;
  size_t in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  drmp3 *in_stack_ffffffffffffffb0;
  int local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint local_4;
  
  if ((*(byte *)(in_RDI + 0x52d0) & 1) == 0) {
    while( true ) {
      if (*(ulong *)(in_RDI + 0x52b8) < 0x4000) {
        if (*(ulong *)(in_RDI + 0x52c0) < 0x4000) {
          *(undefined8 *)(in_RDI + 0x52c0) = 0x4000;
          pvVar2 = realloc(*(void **)(in_RDI + 0x52c8),*(size_t *)(in_RDI + 0x52c0));
          if (pvVar2 == (void *)0x0) {
            return 0;
          }
          *(void **)(in_RDI + 0x52c8) = pvVar2;
        }
        sVar3 = drmp3__on_read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                               in_stack_ffffffffffffffa0);
        if ((sVar3 == 0) && (*(long *)(in_RDI + 0x52b8) == 0)) {
          *(byte *)(in_RDI + 0x52d0) = *(byte *)(in_RDI + 0x52d0) & 0xfe | 1;
          return 0;
        }
        *(size_t *)(in_RDI + 0x52b8) = sVar3 + *(long *)(in_RDI + 0x52b8);
      }
      if (0x7fffffff < *(ulong *)(in_RDI + 0x52b8)) {
        *(byte *)(in_RDI + 0x52d0) = *(byte *)(in_RDI + 0x52d0) & 0xfe | 1;
        return 0;
      }
      iVar1 = drmp3dec_decode_frame
                        (in_stack_000042f8,in_stack_000042f0,in_stack_000042ec,in_stack_000042e0,
                         in_stack_000042d8);
      in_stack_ffffffffffffffb0 = (drmp3 *)(*(long *)(in_RDI + 0x52b8) - (long)local_44);
      if (0 < local_44) {
        memmove(*(void **)(in_RDI + 0x52c8),(void *)(*(long *)(in_RDI + 0x52c8) + (long)local_44),
                (size_t)in_stack_ffffffffffffffb0);
        *(drmp3 **)(in_RDI + 0x52b8) = in_stack_ffffffffffffffb0;
      }
      if ((iVar1 != 0) || ((0 < local_44 && (in_EDX != 0)))) break;
      if (local_44 == 0) {
        if (*(long *)(in_RDI + 0x52c0) == *(long *)(in_RDI + 0x52b8)) {
          *(long *)(in_RDI + 0x52c0) = *(long *)(in_RDI + 0x52c0) + 0x4000;
          in_stack_ffffffffffffffa8 =
               realloc(*(void **)(in_RDI + 0x52c8),*(size_t *)(in_RDI + 0x52c0));
          if (in_stack_ffffffffffffffa8 == (void *)0x0) {
            return 0;
          }
          *(void **)(in_RDI + 0x52c8) = in_stack_ffffffffffffffa8;
        }
        in_stack_ffffffffffffffa0 =
             drmp3__on_read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
        if (in_stack_ffffffffffffffa0 == 0) {
          *(byte *)(in_RDI + 0x52d0) = *(byte *)(in_RDI + 0x52d0) & 0xfe | 1;
          return 0;
        }
        *(size_t *)(in_RDI + 0x52b8) = in_stack_ffffffffffffffa0 + *(long *)(in_RDI + 0x52b8);
      }
    }
    local_4 = drmp3_hdr_frame_samples((drmp3_uint8 *)(in_RDI + 0x1808));
    *(undefined4 *)(in_RDI + 0x1a48) = 0;
    *(uint *)(in_RDI + 0x1a4c) = local_4;
    *(undefined4 *)(in_RDI + 0x1a40) = local_40;
    *(undefined4 *)(in_RDI + 0x1a44) = local_3c;
    drmp3_src_set_input_sample_rate
              ((drmp3_src *)(in_RDI + 0x3e60),*(drmp3_uint32 *)(in_RDI + 0x1a44));
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static drmp3_uint32 drmp3_decode_next_frame_ex(drmp3* pMP3, drmp3d_sample_t* pPCMFrames, drmp3_bool32 discard)
{
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->onRead != NULL);

    if (pMP3->atEnd) {
        return 0;
    }

    drmp3_uint32 pcmFramesRead = 0;
    do {
        // minimp3 recommends doing data submission in 16K chunks. If we don't have at least 16K bytes available, get more.
        if (pMP3->dataSize < DRMP3_DATA_CHUNK_SIZE) {
            if (pMP3->dataCapacity < DRMP3_DATA_CHUNK_SIZE) {
                pMP3->dataCapacity = DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                if (pMP3->dataSize == 0) {
                    pMP3->atEnd = DRMP3_TRUE;
                    return 0; // No data.
                }
            }

            pMP3->dataSize += bytesRead;
        }

        if (pMP3->dataSize > INT_MAX) {
            pMP3->atEnd = DRMP3_TRUE;
            return 0; // File too big.
        }

        drmp3dec_frame_info info;
        pcmFramesRead = drmp3dec_decode_frame(&pMP3->decoder, pMP3->pData, (int)pMP3->dataSize, pPCMFrames, &info);    // <-- Safe size_t -> int conversion thanks to the check above.

        // Consume the data.
        size_t leftoverDataSize = (pMP3->dataSize - (size_t)info.frame_bytes);
        if (info.frame_bytes > 0) {
            memmove(pMP3->pData, pMP3->pData + info.frame_bytes, leftoverDataSize);
            pMP3->dataSize = leftoverDataSize;
        }

        // pcmFramesRead will be equal to 0 if decoding failed. If it is zero and info.frame_bytes > 0 then we have successfully
        // decoded the frame. A special case is if we are wanting to discard the frame, in which case we return successfully.
        if (pcmFramesRead > 0 || (info.frame_bytes > 0 && discard)) {
            pcmFramesRead = drmp3_hdr_frame_samples(pMP3->decoder.header);
            pMP3->pcmFramesConsumedInMP3Frame = 0;
            pMP3->pcmFramesRemainingInMP3Frame = pcmFramesRead;
            pMP3->mp3FrameChannels = info.channels;
            pMP3->mp3FrameSampleRate = info.hz;
            drmp3_src_set_input_sample_rate(&pMP3->src, pMP3->mp3FrameSampleRate);
            break;
        } else if (info.frame_bytes == 0) {
            // Need more data. minimp3 recommends doing data submission in 16K chunks.
            if (pMP3->dataCapacity == pMP3->dataSize) {
                // No room. Expand.
                pMP3->dataCapacity += DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            // Fill in a chunk.
            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                pMP3->atEnd = DRMP3_TRUE;
                return 0; // Error reading more data.
            }

            pMP3->dataSize += bytesRead;
        }
    } while (DRMP3_TRUE);

    return pcmFramesRead;
}